

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::UniformTypes::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nin vec4 position;                    \nuniform vec4 a;                      \nuniform ivec3 b;                     \nuniform uvec2 c[3];                  \nuniform mat2 g[8];                   \nuniform mat3x2 i;                    \nvoid main(void)                      \n{                                    \n    float tmp;                       \n    tmp =  g[0][1][1] + a.z + b.y + c[0].x;   \n    tmp += g[1][1][1] + c[1].x;      \n    tmp += g[2][1][1] + c[2].x;      \n    for (int i = 3; i < 8; ++i)      \n        tmp += g[i][1][1];           \n    tmp = tmp + i[1][1];             \n    gl_Position = position * tmp;    \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   "uniform vec4 a;                      \n"
			   "uniform ivec3 b;                     \n"
			   "uniform uvec2 c[3];                  \n"
			   "uniform mat2 g[8];                   \n"
			   "uniform mat3x2 i;                    \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    float tmp;                       \n"
			   "    tmp =  g[0][1][1] + a.z + b.y + c[0].x;   \n"
			   "    tmp += g[1][1][1] + c[1].x;      \n"
			   "    tmp += g[2][1][1] + c[2].x;      \n"
			   "    for (int i = 3; i < 8; ++i)      \n"
			   "        tmp += g[i][1][1];           \n"
			   "    tmp = tmp + i[1][1];             \n"
			   "    gl_Position = position * tmp;    \n"
			   "}";
	}